

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O1

void __thiscall soul::RenderingVenue::Pimpl::SessionImpl::unload(SessionImpl *this)

{
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  (*(this->super_Session)._vptr_Session[0xc])();
  local_28._8_8_ = 0;
  pcStack_10 = std::
               _Function_handler<void_(std::atomic<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/venue/soul_RenderingVenue.cpp:260:32)>
               ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(std::atomic<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/venue/soul_RenderingVenue.cpp:260:32)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  TaskThread::Queue::addTask(&this->taskQueue,(TaskFunction *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void unload() override
        {
            stop();

            taskQueue.addTask ([this] (TaskThread::ShouldStopFlag&)
            {
                performer->unload();
                setState (SessionState::empty);
            });
        }